

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

void test_qclab_dense_memory<std::complex<float>>(void)

{
  bool bVar1;
  type pcVar2;
  char *pcVar3;
  complex<float> value;
  complex<float> value_00;
  complex<float> value_01;
  AssertHelper local_290;
  Message local_288;
  complex<float> local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_11;
  int64_t i_2;
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> local_258;
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> init10;
  Message local_248;
  complex<float> local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_10;
  Message local_220;
  complex<float> local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_9;
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> local_1f8;
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> init2;
  Message local_1e8;
  complex<float> local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_8;
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> local_1c0;
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> init1;
  Message local_1b0;
  complex<float> local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_7;
  int64_t i_1;
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> mem10;
  Message local_178;
  complex<float> local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_6;
  Message local_150;
  complex<float> local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_5;
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> mem2;
  Message local_120;
  complex<float> local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_4;
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> mem1;
  Message local_f0;
  complex<float> local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_3;
  size_t local_c8;
  int64_t i;
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> alloc10;
  Message local_b0;
  complex<float> local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_2;
  Message local_88;
  complex<float> local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  complex<float> local_60;
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> local_58;
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> alloc2;
  Message local_48;
  complex<float> local_40;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  complex<float> local_18;
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> local_10;
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> alloc1;
  
  qclab::dense::alloc_unique_array<std::complex<float>>((dense *)&local_10,1);
  std::complex<float>::complex(&local_18,5.0,0.0);
  pcVar2 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
           operator[](&local_10,0);
  pcVar2->_M_value = local_18._M_value;
  pcVar2 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
           operator[](&local_10,0);
  std::complex<float>::complex(&local_40,5.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_38,"alloc1[0]","T(5)",pcVar2,&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&alloc2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0xb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&alloc2,&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&alloc2);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  qclab::dense::alloc_unique_array<std::complex<float>>((dense *)&local_58,2);
  std::complex<float>::complex(&local_60,5.0,0.0);
  pcVar2 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
           operator[](&local_58,0);
  pcVar2->_M_value = local_60._M_value;
  std::complex<float>::complex((complex<float> *)&gtest_ar_1.message_,6.0,0.0);
  pcVar2 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
           operator[](&local_58,1);
  pcVar2->_M_value =
       (_ComplexT)
       gtest_ar_1.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  pcVar2 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
           operator[](&local_58,0);
  std::complex<float>::complex(&local_80,5.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_78,"alloc2[0]","T(5)",pcVar2,&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x10,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  pcVar2 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
           operator[](&local_58,1);
  std::complex<float>::complex(&local_a8,6.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_a0,"alloc2[1]","T(6)",pcVar2,&local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&alloc10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x11,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&alloc10,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&alloc10);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  qclab::dense::alloc_unique_array<std::complex<float>>((dense *)&i,10);
  for (local_c8 = 0; (long)local_c8 < 1; local_c8 = local_c8 + 1) {
    std::complex<float>::complex((complex<float> *)&gtest_ar_3.message_,(float)(long)local_c8,0.0);
    pcVar2 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
             operator[]((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>
                         *)&i,local_c8);
    pcVar2->_M_value =
         (_ComplexT)
         gtest_ar_3.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    pcVar2 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
             operator[]((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>
                         *)&i,local_c8);
    std::complex<float>::complex(&local_e8,(float)(long)local_c8,0.0);
    testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
              ((EqHelper *)local_e0,"alloc10[i]","T(i)",pcVar2,&local_e8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&mem1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
                 ,0x16,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&mem1,&local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mem1);
      testing::Message::~Message(&local_f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  }
  qclab::dense::init_unique_array<std::complex<float>>((dense *)&gtest_ar_4.message_,1);
  pcVar2 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
           operator[]((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>
                       *)&gtest_ar_4.message_,0);
  std::complex<float>::complex(&local_118,0.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_110,"mem1[0]","T(0)",pcVar2,&local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mem2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mem2,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mem2);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  qclab::dense::init_unique_array<std::complex<float>>((dense *)&gtest_ar_5.message_,2);
  pcVar2 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
           operator[]((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>
                       *)&gtest_ar_5.message_,0);
  std::complex<float>::complex(&local_148,0.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_140,"mem2[0]","T(0)",pcVar2,&local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  pcVar2 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
           operator[]((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>
                       *)&gtest_ar_5.message_,1);
  std::complex<float>::complex(&local_170,0.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_168,"mem2[1]","T(0)",pcVar2,&local_170);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mem10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mem10,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mem10);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  qclab::dense::init_unique_array<std::complex<float>>((dense *)&i_1,10);
  for (gtest_ar_7.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl =
            (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0;
      (long)gtest_ar_7.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl < 1;
      gtest_ar_7.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )((long)gtest_ar_7.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 1)) {
    pcVar2 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
             operator[]((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>
                         *)&i_1,(size_t)gtest_ar_7.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl);
    std::complex<float>::complex(&local_1a8,0.0,0.0);
    testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
              ((EqHelper *)local_1a0,"mem10[i]","T(0)",pcVar2,&local_1a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&init1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
                 ,0x23,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&init1,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&init1);
      testing::Message::~Message(&local_1b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  }
  std::complex<float>::complex((complex<float> *)&gtest_ar_8.message_,3.14,0.0);
  qclab::dense::init_unique_array<std::complex<float>>((dense *)&local_1c0,1,value);
  pcVar2 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
           operator[](&local_1c0,0);
  std::complex<float>::complex(&local_1e0,3.14,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_1d8,"init1[0]","T(3.14)",pcVar2,&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&init2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x28,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&init2,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&init2);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  std::complex<float>::complex((complex<float> *)&gtest_ar_9.message_,3.14,0.0);
  qclab::dense::init_unique_array<std::complex<float>>((dense *)&local_1f8,2,value_00);
  pcVar2 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
           operator[](&local_1f8,0);
  std::complex<float>::complex(&local_218,3.14,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_210,"init2[0]","T(3.14)",pcVar2,&local_218);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x2b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  pcVar2 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
           operator[](&local_1f8,1);
  std::complex<float>::complex(&local_240,3.14,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_238,"init2[1]","T(3.14)",pcVar2,&local_240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&init10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x2c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&init10,&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&init10);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  std::complex<float>::complex((complex<float> *)&i_2,3.14,0.0);
  qclab::dense::init_unique_array<std::complex<float>>((dense *)&local_258,10,value_01);
  for (gtest_ar_11.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl =
            (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0;
      (long)gtest_ar_11.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl < 1;
      gtest_ar_11.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )((long)gtest_ar_11.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 1)) {
    pcVar2 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
             operator[](&local_258,
                        (size_t)gtest_ar_11.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
    std::complex<float>::complex(&local_280,3.14,0.0);
    testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
              ((EqHelper *)local_278,"init10[i]","T(3.14)",pcVar2,&local_280);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
    if (!bVar1) {
      testing::Message::Message(&local_288);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
      testing::internal::AssertHelper::AssertHelper
                (&local_290,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
                 ,0x30,pcVar3);
      testing::internal::AssertHelper::operator=(&local_290,&local_288);
      testing::internal::AssertHelper::~AssertHelper(&local_290);
      testing::Message::~Message(&local_288);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  }
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_258);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_1f8);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_1c0);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)&i_1)
  ;
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)
             &gtest_ar_5.message_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)
             &gtest_ar_4.message_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)&i);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_58);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_10);
  return;
}

Assistant:

void test_qclab_dense_memory() {

  // alloc_unique_array
  std::unique_ptr< T[] >  alloc1 = qclab::dense::alloc_unique_array< T >( 1 ) ;
  alloc1[0] = T(5) ;
  EXPECT_EQ( alloc1[0] , T(5) ) ;

  std::unique_ptr< T[] >  alloc2 = qclab::dense::alloc_unique_array< T >( 2 ) ;
  alloc2[0] = T(5) ;
  alloc2[1] = T(6) ;
  EXPECT_EQ( alloc2[0] , T(5) ) ;
  EXPECT_EQ( alloc2[1] , T(6) ) ;

  std::unique_ptr< T[] >  alloc10 = qclab::dense::alloc_unique_array< T >( 10 );
  for ( int64_t i = 0; i < 1; i++ ) {
    alloc10[i] = T(i) ;
    EXPECT_EQ( alloc10[i] , T(i) ) ;
  }

  // init_unique_array (zero)
  std::unique_ptr< T[] >  mem1 = qclab::dense::init_unique_array< T >( 1 ) ;
  EXPECT_EQ( mem1[0] , T(0) ) ;

  std::unique_ptr< T[] >  mem2 = qclab::dense::init_unique_array< T >( 2 ) ;
  EXPECT_EQ( mem2[0] , T(0) ) ;
  EXPECT_EQ( mem2[1] , T(0) ) ;

  std::unique_ptr< T[] >  mem10 = qclab::dense::init_unique_array< T >( 10 ) ;
  for ( int64_t i = 0; i < 1; i++ ) {
    EXPECT_EQ( mem10[i] , T(0) ) ;
  }

  // init_unique_array (zero)
  auto init1 = qclab::dense::init_unique_array< T >( 1 , T(3.14) ) ;
  EXPECT_EQ( init1[0] , T(3.14) ) ;

  auto init2 = qclab::dense::init_unique_array< T >( 2 , T(3.14) ) ;
  EXPECT_EQ( init2[0] , T(3.14) ) ;
  EXPECT_EQ( init2[1] , T(3.14) ) ;

  auto init10 = qclab::dense::init_unique_array< T >( 10 , T(3.14) ) ;
  for ( int64_t i = 0; i < 1; i++ ) {
    EXPECT_EQ( init10[i] , T(3.14) ) ;
  }

}